

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O3

QFbScreen * __thiscall QFbScreen::doRedraw(QFbScreen *this)

{
  QRect *pQVar1;
  undefined4 uVar2;
  QRect *pQVar3;
  QFbBackingStore *this_00;
  undefined4 uVar4;
  double dVar5;
  QRect QVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Representation RVar10;
  char cVar11;
  int iVar12;
  QPainter *this_01;
  undefined8 *puVar13;
  undefined8 *puVar14;
  QList<QFbWindow_*> *this_02;
  pointer ppQVar15;
  undefined8 uVar16;
  int iVar17;
  int iVar18;
  GlobalColor GVar19;
  long in_RSI;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long in_FS_OFFSET;
  undefined1 local_b0 [24];
  undefined1 local_98 [12];
  Representation RStack_8c;
  AtomicType local_88;
  undefined8 local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  QRect local_58;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar16 = *(undefined8 *)(in_RSI + 0x50);
  *(undefined8 *)this = 0xaaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  if (((*(long **)(in_RSI + 0x48) != (long *)0x0) &&
      (cVar11 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))(), cVar11 != '\0')) &&
     (cVar11 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xb0))(), cVar11 != '\0')) {
    local_58 = QFbCursor::dirtyRect(*(QFbCursor **)(in_RSI + 0x48));
    QRegion::operator+=((QRegion *)(in_RSI + 0x38),&local_58);
  }
  pQVar1 = (QRect *)(in_RSI + 0x38);
  cVar11 = QRegion::isEmpty();
  QVar6.x2.m_i = local_98._8_4_;
  QVar6.y2.m_i = RStack_8c.m_i;
  QVar6.x1.m_i = local_98._0_4_;
  QVar6.y1.m_i = local_98._4_4_;
  if (cVar11 != '\0') {
    if (*(long **)(in_RSI + 0x48) == (long *)0x0) goto LAB_00113b85;
    cVar11 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))();
    QVar6.x2.m_i = local_98._8_4_;
    QVar6.y2.m_i = RStack_8c.m_i;
    QVar6.x1.m_i = local_98._0_4_;
    QVar6.y1.m_i = local_98._4_4_;
    if (cVar11 == '\0') goto LAB_00113b85;
  }
  if (*(long *)(in_RSI + 0x90) == 0) {
    this_01 = (QPainter *)operator_new(8);
    QPainter::QPainter(this_01,(QPaintDevice *)(in_RSI + 0x78));
    *(QPainter **)(in_RSI + 0x90) = this_01;
  }
  iVar20 = (int)uVar16;
  local_88._M_b._M_p._0_4_ = *(int *)(in_RSI + 0x50) - iVar20;
  iVar21 = (int)((ulong)uVar16 >> 0x20);
  local_80._0_4_ = *(int *)(in_RSI + 0x58) - iVar20;
  local_88._M_b._M_p._4_4_ = *(int *)(in_RSI + 0x54) - iVar21;
  local_80._4_4_ = *(int *)(in_RSI + 0x5c) - iVar21;
  puVar13 = (undefined8 *)QRegion::begin();
  puVar14 = (undefined8 *)QRegion::end();
  if (puVar13 != puVar14) {
    this_02 = (QList<QFbWindow_*> *)(in_RSI + 0x20);
    do {
      local_98._0_8_ = *puVar13;
      unique0x10000485 = puVar13[1];
      _local_98 = (QRect)QRect::operator&((QRect *)local_98,(QRect *)&local_88);
      if ((local_98._0_4_.m_i <= local_98._8_4_.m_i) && (local_98._4_4_.m_i <= local_98._12_4_.m_i))
      {
        QPainter::setCompositionMode((CompositionMode)*(undefined8 *)(in_RSI + 0x90));
        pQVar3 = *(QRect **)(in_RSI + 0x90);
        cVar11 = QImage::hasAlphaChannel();
        GVar19 = black;
        if (cVar11 != '\0') {
          GVar19 = transparent;
        }
        QColor::QColor((QColor *)&local_58,GVar19);
        QPainter::fillRect(pQVar3,(QColor *)local_98);
        iVar22 = *(int *)(in_RSI + 0x30);
        while (iVar22 != 0) {
          iVar22 = iVar22 + -1;
          QList<QFbWindow_*>::data(this_02);
          QPlatformWindow::window();
          cVar11 = QWindow::isVisible();
          if (cVar11 != '\0') {
            ppQVar15 = QList<QFbWindow_*>::data(this_02);
            uVar16 = (**(code **)(*(long *)ppQVar15[iVar22] + 0x30))();
            uVar7 = local_98._0_4_;
            uVar8 = local_98._4_4_;
            uVar9 = local_98._8_4_;
            RVar10.m_i = RStack_8c.m_i;
            ppQVar15 = QList<QFbWindow_*>::data(this_02);
            this_00 = ppQVar15[iVar22]->mBackingStore;
            if (this_00 != (QFbBackingStore *)0x0) {
              iVar12 = (int)((ulong)uVar16 >> 0x20) - iVar21;
              iVar18 = (int)uVar16 - iVar20;
              iVar23 = uVar8 - iVar12;
              iVar17 = uVar7 - iVar18;
              QFbBackingStore::lock(this_00);
              uVar16 = *(undefined8 *)(in_RSI + 0x90);
              QFbBackingStore::image((QFbBackingStore *)local_b0);
              dVar5 = (double)local_98._4_4_.m_i;
              local_58.x2.m_i = SUB84(dVar5,0);
              local_58._0_8_ = (double)local_98._0_4_.m_i;
              local_58.y2.m_i = (int)((ulong)dVar5 >> 0x20);
              local_48 = (double)(((long)(int)local_98._8_4_ - (long)local_98._0_4_.m_i) + 1);
              local_40 = (double)(((long)RStack_8c.m_i - (long)local_98._4_4_.m_i) + 1);
              local_78 = (double)iVar17;
              local_70 = (double)iVar23;
              local_68 = (double)(((long)(uVar9 - iVar18) - (long)iVar17) + 1);
              local_60 = (double)(((long)(RVar10.m_i - iVar12) - (long)iVar23) + 1);
              QPainter::drawImage(uVar16,&local_58,(QFbBackingStore *)local_b0,&local_78,0);
              QImage::~QImage((QImage *)local_b0);
              QFbBackingStore::unlock(this_00);
            }
          }
        }
      }
      puVar13 = puVar13 + 2;
    } while (puVar13 != puVar14);
  }
  if (*(long **)(in_RSI + 0x48) != (long *)0x0) {
    cVar11 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))();
    if (cVar11 == '\0') {
      local_58 = (QRect)(**(code **)(**(long **)(in_RSI + 0x48) + 0xb8))();
      cVar11 = QRegion::intersects(pQVar1);
      if (cVar11 == '\0') goto LAB_00113b56;
    }
    QPainter::setCompositionMode((CompositionMode)*(undefined8 *)(in_RSI + 0x90));
    local_58 = (QRect)(**(code **)(**(long **)(in_RSI + 0x48) + 0x98))
                                (*(long **)(in_RSI + 0x48),*(undefined8 *)(in_RSI + 0x90));
    QRegion::operator+=((QRegion *)this,&local_58);
  }
LAB_00113b56:
  QRegion::operator+=((QRegion *)this,(QRegion *)pQVar1);
  QRegion::QRegion((QRegion *)&local_58);
  QVar6 = local_58;
  uVar2 = pQVar1->x1;
  uVar4 = pQVar1->y1;
  local_58.y1.m_i = uVar4;
  local_58.x1.m_i = uVar2;
  uVar16 = local_58._0_8_;
  local_58._0_8_ = QVar6._0_8_;
  pQVar1->x1 = (Representation)local_58.x1.m_i;
  pQVar1->y1 = (Representation)local_58.y1.m_i;
  local_58._8_8_ = QVar6._8_8_;
  local_58 = (QRect)CONCAT88(local_58._8_8_,uVar16);
  QRegion::~QRegion((QRegion *)&local_58);
  QVar6 = _local_98;
LAB_00113b85:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    _local_98 = QVar6;
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QRegion QFbScreen::doRedraw()
{
    const QPoint screenOffset = mGeometry.topLeft();

    QRegion touchedRegion;
    if (mCursor && mCursor->isDirty() && mCursor->isOnScreen()) {
        const QRect lastCursor = mCursor->dirtyRect();
        mRepaintRegion += lastCursor;
    }
    if (mRepaintRegion.isEmpty() && (!mCursor || !mCursor->isDirty()))
        return touchedRegion;

    if (!mPainter)
        mPainter = new QPainter(&mScreenImage);

    const QRect screenRect = mGeometry.translated(-screenOffset);
    for (QRect rect : mRepaintRegion) {
        rect = rect.intersected(screenRect);
        if (rect.isEmpty())
            continue;

        mPainter->setCompositionMode(QPainter::CompositionMode_Source);
        mPainter->fillRect(rect, mScreenImage.hasAlphaChannel() ? Qt::transparent : Qt::black);

        for (int layerIndex = mWindowStack.size() - 1; layerIndex != -1; layerIndex--) {
            if (!mWindowStack[layerIndex]->window()->isVisible())
                continue;

            const QRect windowRect = mWindowStack[layerIndex]->geometry().translated(-screenOffset);
            const QRect windowIntersect = rect.translated(-windowRect.left(), -windowRect.top());
            QFbBackingStore *backingStore = mWindowStack[layerIndex]->backingStore();
            if (backingStore) {
                backingStore->lock();
                mPainter->drawImage(rect, backingStore->image(), windowIntersect);
                backingStore->unlock();
            }
        }
    }

    if (mCursor && (mCursor->isDirty() || mRepaintRegion.intersects(mCursor->lastPainted()))) {
        mPainter->setCompositionMode(QPainter::CompositionMode_SourceOver);
        touchedRegion += mCursor->drawCursor(*mPainter);
    }
    touchedRegion += mRepaintRegion;
    mRepaintRegion = QRegion();

    return touchedRegion;
}